

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcie_cfg_write.c
# Opt level: O1

void usage(void)

{
  puts(
      "usage\n    -r remote addr\n    -l local addr\n    -a 0xXX (hex), target addr in PCIe configuration space\n    -d 0xXX (hex) data to be written\n    -s size in bytes"
      );
  return;
}

Assistant:

void usage(void)
{
	printf("usage\n"
	       "    -r remote addr\n"
	       "    -l local addr\n"
	       "    -a 0xXX (hex), target addr in PCIe configuration space\n"
	       "    -d 0xXX (hex) data to be written\n"
	       "    -s size in bytes\n");
}